

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O0

HRESULT __thiscall
ChakraCoreHostScriptContext::FetchImportedModuleFromScript
          (ChakraCoreHostScriptContext *this,JsSourceContext dwReferencingSourceContext,
          LPCOLESTR specifier,ModuleRecordBase **dependentModuleRecord)

{
  JsErrorCode JVar1;
  ScriptContext *scriptContext;
  JavascriptString *pJVar2;
  AutoFilterExceptionRegion local_44;
  JsErrorCode errorCode;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  JsModuleRecord dependentRecord;
  JavascriptString *specifierVar;
  ModuleRecordBase **dependentModuleRecord_local;
  LPCOLESTR specifier_local;
  JsSourceContext dwReferencingSourceContext_local;
  ChakraCoreHostScriptContext *this_local;
  
  if (this->fetchImportedModuleFromScriptCallback == (FetchImportedModuleFromScriptCallBack)0x0) {
    this_local._4_4_ = -0x7ff8ffa9;
  }
  else {
    scriptContext = HostScriptContext::GetScriptContext(&this->super_HostScriptContext);
    pJVar2 = Js::JavascriptString::NewCopySz(specifier,scriptContext);
    _errorCode = (ModuleRecordBase *)0x0;
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_44,ExceptionType_All);
    JVar1 = (*this->fetchImportedModuleFromScriptCallback)
                      (dwReferencingSourceContext,pJVar2,(JsModuleRecord *)&errorCode);
    if (JVar1 == JsNoError) {
      *dependentModuleRecord = _errorCode;
      this_local._4_4_ = 0;
    }
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_44);
    if (JVar1 != JsNoError) {
      this_local._4_4_ = -0x7ff8ffa9;
    }
  }
  return this_local._4_4_;
}

Assistant:

HRESULT ChakraCoreHostScriptContext::FetchImportedModuleFromScript(JsSourceContext dwReferencingSourceContext, LPCOLESTR specifier, Js::ModuleRecordBase** dependentModuleRecord)
{
    if (fetchImportedModuleFromScriptCallback == nullptr)
    {
        return E_INVALIDARG;
    }
    Js::JavascriptString* specifierVar = Js::JavascriptString::NewCopySz(specifier, GetScriptContext());
    JsModuleRecord dependentRecord = JS_INVALID_REFERENCE;
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = fetchImportedModuleFromScriptCallback(dwReferencingSourceContext, specifierVar, &dependentRecord);
        if (errorCode == JsNoError)
        {
            *dependentModuleRecord = static_cast<Js::ModuleRecordBase*>(dependentRecord);
            return NOERROR;
        }
    }
    return E_INVALIDARG;
}